

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result wabt::ResolveNamesScript(Script *script,Errors *errors)

{
  pointer puVar1;
  Command *base;
  ModuleCommand *pMVar2;
  AssertModuleCommand<(wabt::CommandType)4> *pAVar3;
  AssertModuleCommand<(wabt::CommandType)5> *pAVar4;
  pointer puVar5;
  NameResolver local_178;
  undefined1 local_e0 [8];
  NameResolver resolver;
  Errors errors_1;
  
  anon_unknown_13::NameResolver::NameResolver((NameResolver *)local_e0,script,errors);
  puVar5 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar1) {
      anon_unknown_13::NameResolver::~NameResolver((NameResolver *)local_e0);
      return (Result)(Enum)resolver.labels_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    base = (puVar5->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
           _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
           super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    switch(base->type) {
    case First:
      pMVar2 = cast<wabt::ModuleCommand,wabt::Command>(base);
      anon_unknown_13::NameResolver::VisitModule((NameResolver *)local_e0,&pMVar2->module);
      break;
    case AssertInvalid:
      pAVar3 = cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>(base);
      resolver.result_.enum_ = Ok;
      resolver._148_4_ = 0;
      anon_unknown_13::NameResolver::NameResolver
                (&local_178,(Script *)resolver.errors_,(Errors *)&resolver.result_);
      anon_unknown_13::NameResolver::VisitScriptModule
                (&local_178,
                 (pAVar3->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
      anon_unknown_13::NameResolver::~NameResolver(&local_178);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&resolver.result_);
      break;
    case AssertUnlinkable:
      pAVar4 = cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>(base);
      goto LAB_00d9c57a;
    case AssertUninstantiable:
      pAVar4 = (AssertModuleCommand<(wabt::CommandType)5> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>(base);
LAB_00d9c57a:
      anon_unknown_13::NameResolver::VisitScriptModule
                ((NameResolver *)local_e0,
                 (pAVar4->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

Result ResolveNamesScript(Script* script, Errors* errors) {
  NameResolver resolver(script, errors);
  return resolver.VisitScript(script);
}